

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O1

void gutil::anon_unknown_4::printDescription(ostream *out,string *descr,size_t col,size_t n)

{
  pointer pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  char local_4b [3];
  string *local_48;
  size_t local_40;
  size_t local_38;
  
  uVar5 = descr->_M_string_length;
  cVar2 = (char)out;
  local_38 = col;
  if (uVar5 != 0) {
    uVar9 = 0;
    local_48 = descr;
    local_40 = n;
    do {
      pcVar1 = (descr->_M_dataplus)._M_p;
      uVar6 = uVar9 + 1;
      uVar8 = uVar9;
      if (uVar9 + 1 < uVar5) {
        uVar6 = uVar5;
      }
      do {
        iVar4 = isspace((int)pcVar1[uVar8]);
        uVar9 = uVar8;
        if (iVar4 == 0) break;
        uVar8 = uVar8 + 1;
        uVar9 = uVar6;
      } while (uVar6 != uVar8);
      uVar6 = uVar9;
      if (uVar9 < uVar5) {
        pcVar1 = (local_48->_M_dataplus)._M_p;
        uVar8 = uVar9;
        do {
          iVar4 = isspace((int)pcVar1[uVar8]);
          uVar6 = uVar8;
          if (iVar4 != 0) break;
          uVar8 = uVar8 + 1;
          uVar6 = uVar5;
        } while (uVar5 != uVar8);
      }
      sVar3 = local_38;
      if (local_38 < col && local_40 < (col - uVar9) + uVar6 + 1) {
        std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        if (sVar3 == 0) {
          col = 0;
        }
        else {
          sVar7 = sVar3;
          do {
            local_4b[1] = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(out,local_4b + 1,1);
            sVar7 = sVar7 - 1;
            col = sVar3;
          } while (sVar7 != 0);
        }
      }
      uVar5 = ~col + uVar9 + local_40;
      if ((uVar6 - uVar9) + col + 1 <= local_40) {
        uVar5 = uVar6;
      }
      if (col == 0) {
        col = 0;
        descr = local_48;
      }
      else {
        col = col + 1;
        local_4b[2] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(out,local_4b + 2,1);
        descr = local_48;
      }
      for (; uVar9 < uVar5; uVar9 = uVar9 + 1) {
        local_4b[0] = (descr->_M_dataplus)._M_p[uVar9];
        std::__ostream_insert<char,std::char_traits<char>>(out,local_4b,1);
        col = col + 1;
      }
      uVar5 = descr->_M_string_length;
    } while (uVar9 < uVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void printDescription(std::ostream &out, std::string descr, size_t col, size_t n)
{
  size_t i=0;
  size_t c=col;

  while (i < descr.size())
  {
    while (i<descr.size() && isspace(descr[i]))
    {
      i++;
    }

    size_t k=i;

    while (k < descr.size() && !isspace(descr[k]))
    {
      k++;
    }

    if (c+1+k-i > n && c > col)
    {
      out << std::endl;

      for (c=0; c<col; c++)
      {
        out << ' ';
      }
    }

    if (c+1+k-i > n)
    {
      k=i+n-c-1;
    }

    if (c > 0)
    {
      out << ' ';
      c++;
    }

    while (i < k)
    {
      out << descr[i++];
      c++;
    }
  }

  out << std::endl;
}